

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

int __thiscall
kratos::RawStringStmt::clone
          (RawStringStmt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  shared_ptr<kratos::Stmt> local_38;
  undefined1 local_28 [8];
  shared_ptr<kratos::RawStringStmt> stmt;
  RawStringStmt *this_local;
  
  stmt.super___shared_ptr<kratos::RawStringStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__fn;
  std::
  make_shared<kratos::RawStringStmt,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_28);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::RawStringStmt,void>
            (&local_38,(shared_ptr<kratos::RawStringStmt> *)local_28);
  Stmt::copy_meta((Stmt *)__fn,&local_38);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_38);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::RawStringStmt,void>
            ((shared_ptr<kratos::Stmt> *)this,(shared_ptr<kratos::RawStringStmt> *)local_28);
  std::shared_ptr<kratos::RawStringStmt>::~shared_ptr((shared_ptr<kratos::RawStringStmt> *)local_28)
  ;
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> RawStringStmt::clone() const {
    auto stmt = std::make_shared<RawStringStmt>(stmts_);
    copy_meta(stmt);
    return stmt;
}